

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O3

void __thiscall foxxll::linuxaio_queue::post_requests(linuxaio_queue *this)

{
  value_type vVar1;
  pointer pCVar2;
  Semaphore *this_00;
  bool bVar3;
  __pid_t _Var4;
  io_event *events;
  void *pvVar5;
  linuxaio_request *this_01;
  iocb *piVar6;
  long lVar7;
  ostream *poVar8;
  int *piVar9;
  char *pcVar10;
  io_error *piVar11;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  size_t i;
  ulong uVar12;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *this_02;
  pointer pCVar13;
  int iVar14;
  iterator iVar15;
  ulong uVar16;
  _List_node_base *this_03;
  Semaphore *this_04;
  request_ptr req;
  vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  reqs;
  unique_lock<std::mutex> lock;
  request_ptr req_1;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_240;
  vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  local_238;
  unique_lock<std::mutex> local_218;
  _List_node_base *local_208;
  Semaphore *local_200;
  Semaphore *local_1f8;
  mutex *local_1f0;
  request *local_1e8;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *local_1e0;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *local_1d8;
  Semaphore *local_1d0;
  string local_1c8;
  unique_lock<std::mutex> local_1a8 [23];
  
  iVar14 = this->max_events_;
  if ((long)iVar14 == 0) {
    events = (io_event *)0x0;
  }
  else {
    uVar16 = 0xffffffffffffffff;
    if (-1 < iVar14) {
      uVar16 = (long)iVar14 << 5;
    }
    events = (io_event *)operator_new__(uVar16);
  }
  this_04 = &this->num_waiting_requests_;
  local_1e8 = (request *)&this->post_thread_state_;
  local_1f0 = &this->waiting_mtx_;
  this_03 = (_List_node_base *)&this->waiting_requests_;
  local_1f8 = &this->num_free_events_;
  local_1d0 = &this->num_posted_requests_;
  local_208 = this_03;
  local_200 = this_04;
  do {
    _Var4 = tlx::Semaphore::wait(this_04,(void *)0x1);
    local_1a8[0]._M_device = (mutex_type *)local_1e8;
    local_1a8[0]._M_owns = false;
    std::unique_lock<std::mutex>::lock(local_1a8);
    local_1a8[0]._M_owns = true;
    vVar1 = (this->post_thread_state_).state_;
    std::unique_lock<std::mutex>::~unique_lock(local_1a8);
    if ((_Var4 == 0) && (vVar1 == TERMINATING)) {
      if (events != (io_event *)0x0) {
        operator_delete__(events);
      }
      return;
    }
    local_218._M_device = local_1f0;
    local_218._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_218);
    this_00 = local_1f8;
    local_218._M_owns = true;
    iVar15._M_node = this_03->_M_next;
    if (iVar15._M_node == this_03) {
      std::unique_lock<std::mutex>::unlock(&local_218);
      tlx::Semaphore::signal(this_04,(int)iVar15._M_node,__handler_01);
    }
    else {
      local_238.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)0x0;
      local_238.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)0x0;
      local_238.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)0x0;
      local_240.ptr_ = (request *)iVar15._M_node[1]._M_next;
      if (local_240.ptr_ != (request *)0x0) {
        LOCK();
        ((local_240.ptr_)->super_reference_counter).reference_count_.
        super___atomic_base<unsigned_long>._M_i =
             (__int_type)
             ((long)&((_List_node_base *)
                     ((local_240.ptr_)->super_reference_counter).reference_count_.
                     super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
        UNLOCK();
        iVar15._M_node = this_03->_M_next;
      }
      std::__cxx11::
      list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::_M_erase((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                  *)this_03,iVar15);
      if (local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
        ::_M_realloc_insert<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>
                  ((vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
                    *)&local_238,
                   (iterator)
                   local_238.
                   super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_240);
      }
      else {
        (local_238.
         super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->ptr_ = local_240.ptr_;
        local_240.ptr_ = (request *)0x0;
        local_238.
        super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_238.
             super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      while( true ) {
        if ((this_03->_M_next == this_03) ||
           (bVar3 = tlx::Semaphore::try_acquire(this_00,1,1), !bVar3)) goto LAB_00149dd8;
        iVar14 = 1;
        bVar3 = tlx::Semaphore::try_acquire(this_04,1,0);
        if (!bVar3) break;
        iVar15._M_node = this_03->_M_next;
        local_1a8[0]._M_device = (mutex_type *)iVar15._M_node[1]._M_next;
        if ((request *)local_1a8[0]._M_device != (request *)0x0) {
          LOCK();
          (((request *)local_1a8[0]._M_device)->super_reference_counter).reference_count_.
          super___atomic_base<unsigned_long>._M_i =
               (__int_type)
               ((long)&((_List_node_base *)
                       (((request *)local_1a8[0]._M_device)->super_reference_counter).
                       reference_count_.super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
          UNLOCK();
          iVar15._M_node = this_03->_M_next;
        }
        std::__cxx11::
        list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ::_M_erase((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                    *)this_03,iVar15);
        if (local_238.
            super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_238.
            super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
          ::_M_realloc_insert<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>
                    ((vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
                      *)&local_238,
                     (iterator)
                     local_238.
                     super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_1a8);
        }
        else {
          (local_238.
           super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->ptr_ = (request *)local_1a8[0]._M_device;
          local_1a8[0]._M_device = (mutex_type *)0x0;
          local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_238.
               super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                  ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_1a8);
      }
      tlx::Semaphore::signal(this_00,iVar14,__handler);
LAB_00149dd8:
      std::unique_lock<std::mutex>::unlock(&local_218);
      tlx::Semaphore::wait(this_00,(void *)0x1);
      pCVar13 = local_238.
                super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)local_238.
                     super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_238.
                     super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      local_1d8 = local_238.
                  super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_1e0 = local_238.
                  super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)local_238.
                super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_238.
                super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        pvVar5 = (void *)0x0;
      }
      else {
        pvVar5 = operator_new__(-(ulong)(uVar16 >> 0x3d != 0) |
                                (long)local_238.
                                      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_238.
                                      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        uVar12 = 0;
        do {
          this_01 = (linuxaio_request *)
                    __dynamic_cast(pCVar13[uVar12].ptr_,&request::typeinfo,
                                   &linuxaio_request::typeinfo,0);
          piVar6 = linuxaio_request::fill_control_block(this_01);
          *(iocb **)((long)pvVar5 + uVar12 * 8) = piVar6;
          uVar12 = uVar12 + 1;
          pCVar13 = local_238.
                    super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)local_238.
                                        super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_238.
                                        super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      pCVar2 = local_238.
               super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pCVar13 = local_238.
                super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      this_02 = local_238.
                super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_238.
          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(this_02);
          this_02 = this_02 + 1;
        } while (this_02 != pCVar2);
        local_238.
        super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar13;
      }
      if (local_1e0 != local_1d8) {
        uVar12 = 0;
        do {
          lVar7 = syscall(0xd1,this->context_,uVar16 - uVar12,(void *)((long)pvVar5 + uVar12 * 8));
          if (lVar7 < 1) {
            piVar9 = __errno_location();
            if (*piVar9 != 0xb) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"void foxxll::linuxaio_queue::post_requests()",0x2c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"linuxaio_request::post io_submit()",0x22);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
              pcVar10 = strerror(*piVar9);
              std::operator<<((ostream *)local_1a8,pcVar10);
              piVar11 = (io_error *)__cxa_allocate_exception(0x20);
              std::__cxx11::stringbuf::str();
              io_error::io_error(piVar11,&local_1c8);
              __cxa_throw(piVar11,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
            }
          }
          else {
            tlx::Semaphore::signal(local_1d0,(int)lVar7,__handler_00);
            uVar12 = uVar12 + lVar7;
            if (uVar12 == uVar16) break;
          }
          lVar7 = syscall(0xd0,this->context_,0,(ulong)(uint)this->max_events_,events,0);
          if (lVar7 < 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error in ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"void foxxll::linuxaio_queue::post_requests()",0x2c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," : ",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "linuxaio_queue::post_requests io_getevents() nr_events=",0x37);
            poVar8 = std::ostream::_M_insert<long>((long)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," : ",3);
            piVar9 = __errno_location();
            pcVar10 = strerror(*piVar9);
            std::operator<<(poVar8,pcVar10);
            piVar11 = (io_error *)__cxa_allocate_exception(0x20);
            std::__cxx11::stringbuf::str();
            io_error::io_error(piVar11,&local_1c8);
            __cxa_throw(piVar11,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
          }
          if (lVar7 != 0) {
            handle_events(this,events,lVar7,false);
          }
        } while (uVar12 < uVar16);
      }
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
      }
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(&local_240);
      std::
      vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::~vector(&local_238);
      this_03 = local_208;
      this_04 = local_200;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_218);
  } while( true );
}

Assistant:

void linuxaio_queue::post_requests()
{
    tlx::simple_vector<io_event> events(max_events_);

    for ( ; ; ) // as long as thread is running
    {
        // block until next request or message comes in
        int num_currently_waiting_requests = num_waiting_requests_.wait();

        // terminate if termination has been requested
        if (post_thread_state_() == TERMINATING &&
            num_currently_waiting_requests == 0)
            break;

        std::unique_lock<std::mutex> lock(waiting_mtx_);
        if (TLX_UNLIKELY(waiting_requests_.empty())) {
            // unlock queue
            lock.unlock();

            // num_waiting_requests_-- was premature, compensate for that
            num_waiting_requests_.signal();
            continue;
        }

        // collect requests from waiting queue: first is there
        std::vector<request_ptr> reqs;

        request_ptr req = waiting_requests_.front();
        waiting_requests_.pop_front();
        reqs.emplace_back(std::move(req));

        // collect additional requests
        while (!waiting_requests_.empty()) {
            // acquire one free event, but keep one in slack
            if (!num_free_events_.try_acquire(/* delta */ 1, /* slack */ 1))
                break;
            if (!num_waiting_requests_.try_acquire()) {
                num_free_events_.signal();
                break;
            }

            request_ptr req = waiting_requests_.front();
            waiting_requests_.pop_front();
            reqs.emplace_back(std::move(req));
        }

        lock.unlock();

        // the last free_event must be acquired outside of the lock.
        num_free_events_.wait();

        // construct batch iocb
        tlx::simple_vector<iocb*> cbs(reqs.size());

        for (size_t i = 0; i < reqs.size(); ++i) {
            // polymorphic_downcast
            auto ar = dynamic_cast<linuxaio_request*>(reqs[i].get());
            cbs[i] = ar->fill_control_block();
        }
        reqs.clear();

        // io_submit loop
        size_t cb_done = 0;
        while (cb_done < cbs.size()) {
            long success = syscall(
                    SYS_io_submit, context_,
                    cbs.size() - cb_done,
                    cbs.data() + cb_done
                );

            if (success <= 0 && errno != EAGAIN) {
                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_request::post io_submit()"
                );
            }
            if (success > 0) {
                // request is posted
                num_posted_requests_.signal(success);

                cb_done += success;
                if (cb_done == cbs.size())
                    break;
            }

            // post failed, so first handle events to make queues (more) empty,
            // then try again.

            // wait for at least one event to complete, no time limit
            long num_events = syscall(
                    SYS_io_getevents, context_, 0,
                    max_events_, events.data(), nullptr
                );
            if (num_events < 0) {
                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_queue::post_requests"
                    " io_getevents() nr_events=" << num_events
                );
            }
            if (num_events > 0)
                handle_events(events.data(), num_events, false);
        }
    }
}